

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_ws.hpp
# Opt level: O3

string * __thiscall
SimpleWeb::
SocketClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>>>
::InMessage::string_abi_cxx11_(string *__return_storage_ptr__,InMessage *this)

{
  void *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  const_buffer *pcVar3;
  ulong uVar4;
  size_type __dnew;
  size_type local_80;
  buffers_iterator<asio::const_buffers_1,_char> local_78;
  const_buffer local_40;
  
  pvVar1 = *(void **)(this + 0x30);
  uVar4 = *(long *)(this + 0x48) - (long)pvVar1;
  pcVar3 = &local_40;
  if (uVar4 == 0) {
    pcVar3 = (const_buffer *)&stack0xffffffffffffffd0;
  }
  paVar2 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar2;
  local_80 = uVar4;
  local_40.data_ = pvVar1;
  local_40.size_ = uVar4;
  if (0xf < uVar4) {
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)std::__cxx11::string::_M_create((ulong *)__return_storage_ptr__,(ulong)&local_80);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_80;
  }
  local_78.current_buffer_position_ = 0;
  local_78.begin_ = &local_40;
  local_78.position_ = 0;
  if (uVar4 != 0) {
    local_78.current_buffer_.data_ = pvVar1;
    local_78.current_buffer_.size_ = uVar4;
    local_78.current_ = pcVar3;
    local_78.end_ = (buffer_sequence_iterator_type)&stack0xffffffffffffffd0;
    do {
      paVar2->_M_local_buf[0] =
           *(char *)((long)local_78.current_buffer_.data_ + local_78.current_buffer_position_);
      asio::buffers_iterator<asio::const_buffers_1,_char>::increment(&local_78);
      paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)paVar2 + 1);
    } while (local_78.position_ != uVar4);
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(__return_storage_ptr__->_M_dataplus)._M_p;
  }
  __return_storage_ptr__->_M_string_length = local_80;
  paVar2->_M_local_buf[local_80] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string string() noexcept {
        return std::string(asio::buffers_begin(streambuf.data()), asio::buffers_end(streambuf.data()));
      }